

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  string *psVar4;
  char *pcVar5;
  string *in_RDI;
  FilePath result;
  FilePath output_name;
  char *colon;
  string format;
  char *gtest_output_flag;
  FilePath *in_stack_fffffffffffffce8;
  FilePath *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  allocator *base_name;
  FilePath *in_stack_fffffffffffffd48;
  string *relative_path;
  FilePath *in_stack_fffffffffffffd88;
  FilePath local_238;
  allocator local_211;
  string local_210 [71];
  allocator local_1c9;
  string local_1c8 [8];
  char *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  FilePath *in_stack_fffffffffffffe50;
  FilePath *in_stack_fffffffffffffe58;
  allocator local_161;
  string local_160 [32];
  FilePath local_140;
  undefined4 local_120;
  allocator local_119;
  string local_118 [71];
  allocator local_d1;
  string local_d0 [64];
  FilePath local_90;
  char *local_70;
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  char *local_10;
  
  relative_path = in_RDI;
  local_10 = (char *)std::__cxx11::string::c_str();
  GetOutputFormat_abi_cxx11_();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"xml",&local_51);
    std::__cxx11::string::operator=(local_30,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  local_70 = strchr(local_10,0x3a);
  if (local_70 == (char *)0x0) {
    UnitTest::GetInstance();
    pcVar3 = UnitTest::original_working_dir((UnitTest *)0x160828);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,pcVar3,&local_d1);
    FilePath::FilePath((FilePath *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcf8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"test_detail",&local_119);
    FilePath::FilePath((FilePath *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcf8);
    std::__cxx11::string::c_str();
    FilePath::MakeFileName
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
               in_stack_fffffffffffffe40);
    psVar4 = FilePath::string_abi_cxx11_(&local_90);
    std::__cxx11::string::string((string *)in_RDI,(string *)psVar4);
    FilePath::~FilePath((FilePath *)0x16091b);
    FilePath::~FilePath((FilePath *)0x160928);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    FilePath::~FilePath((FilePath *)0x16094f);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    local_120 = 1;
  }
  else {
    pcVar3 = local_70 + 1;
    base_name = &local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,pcVar3,base_name);
    FilePath::FilePath((FilePath *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcf8);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    bVar1 = FilePath::IsAbsolutePath(in_stack_fffffffffffffcf0);
    if (!bVar1) {
      UnitTest::GetInstance();
      pcVar5 = UnitTest::original_working_dir((UnitTest *)0x160b1d);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,pcVar5,&local_1c9);
      FilePath::FilePath((FilePath *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         in_stack_fffffffffffffcf8);
      pcVar5 = local_70 + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,pcVar5,&local_211);
      FilePath::FilePath((FilePath *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         in_stack_fffffffffffffcf8);
      FilePath::ConcatPaths(in_stack_fffffffffffffd88,(FilePath *)relative_path);
      FilePath::operator=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      FilePath::~FilePath((FilePath *)0x160bfb);
      FilePath::~FilePath((FilePath *)0x160c08);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      FilePath::~FilePath((FilePath *)0x160c2f);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    }
    bVar1 = FilePath::IsDirectory
                      ((FilePath *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    if (bVar1) {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      std::__cxx11::string::c_str();
      FilePath::GenerateUniqueFileName(in_stack_fffffffffffffd48,(FilePath *)base_name,pcVar3);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd88);
      FilePath::~FilePath((FilePath *)0x160e54);
      psVar4 = FilePath::string_abi_cxx11_(&local_238);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar4);
      local_120 = 1;
      FilePath::~FilePath((FilePath *)0x160e94);
    }
    else {
      psVar4 = FilePath::string_abi_cxx11_(&local_140);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar4);
      local_120 = 1;
    }
    FilePath::~FilePath((FilePath *)0x160f0c);
  }
  std::__cxx11::string::~string(local_30);
  return relative_path;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();

  std::string format = GetOutputFormat();
  if (format.empty())
    format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return internal::FilePath::MakeFileName(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile), 0,
        format.c_str()).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // FIXME: on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}